

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O0

int ImfHeaderV3iAttribute(ImfHeader *hdr,char *name,int *x,int *y,int *z)

{
  TypedAttribute<Imath_3_2::Vec3<int>_> *this;
  Vec3<int> *pVVar1;
  int *in_RCX;
  int *in_RDX;
  ImfHeader *in_RDI;
  Header *in_R8;
  exception *e;
  V3i *v;
  char *in_stack_ffffffffffffffc8;
  
  anon_unknown.dwarf_70604::header(in_RDI);
  this = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>>>
                   (in_R8,in_stack_ffffffffffffffc8);
  pVVar1 = Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>_>::value(this);
  *in_RDX = pVVar1->x;
  *in_RCX = pVVar1->y;
  *(int *)&(in_R8->_map)._M_t._M_impl = pVVar1->z;
  return 1;
}

Assistant:

int
ImfHeaderV3iAttribute (
    const ImfHeader* hdr, const char name[], int* x, int* y, int* z)
{
    try
    {
        const V3i& v =
            header (hdr)
                ->typedAttribute<OPENEXR_IMF_INTERNAL_NAMESPACE::V3iAttribute> (
                    name)
                .value ();

        *x = v.x;
        *y = v.y;
        *z = v.z;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}